

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_GetRepeatedStringView_Test::
GeneratedMessageReflectionTest_GetRepeatedStringView_Test
          (GeneratedMessageReflectionTest_GetRepeatedStringView_Test *this)

{
  GeneratedMessageReflectionTest_GetRepeatedStringView_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionTest_GetRepeatedStringView_Test_029c77d8;
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetRepeatedStringView) {
  unittest::TestAllTypes message;
  TestUtil::AddRepeatedFields1(&message);
  TestUtil::AddRepeatedFields2(&message);

  const Reflection* reflection = message.GetReflection();
  Reflection::ScratchSpace scratch;

  EXPECT_EQ("215", reflection->GetRepeatedStringView(
                       message, F("repeated_string"), 0, scratch));
  EXPECT_EQ("224", reflection->GetRepeatedStringView(
                       message, F("repeated_string_piece"), 0, scratch));
  EXPECT_EQ("225", reflection->GetRepeatedStringView(
                       message, F("repeated_cord"), 0, scratch));
}